

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_yinelem(lysp_ctx *ctx,lysp_stmt *stmt,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  LY_ERR LVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  ly_ctx *local_60;
  ly_ctx *local_50;
  ly_ctx *local_48;
  lysp_stmt *plStack_38;
  LY_ERR ret__;
  lysp_stmt *child;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if ((*flags & 0x180) == 0) {
    iVar1 = strcmp(stmt->arg,"true");
    if (iVar1 == 0) {
      *flags = *flags | 0x80;
    }
    else {
      iVar1 = strcmp(stmt->arg,"false");
      if (iVar1 != 0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_50 = (ly_ctx *)0x0;
        }
        else {
          local_50 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        sVar3 = strlen(stmt->arg);
        ly_vlog(local_50,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                sVar3 & 0xffffffff,stmt->arg,"yin-element");
        return LY_EVALID;
      }
      *flags = *flags | 0x100;
    }
    for (plStack_38 = stmt->child; plStack_38 != (lysp_stmt *)0x0; plStack_38 = plStack_38->next) {
      if (plStack_38->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          local_60 = (ly_ctx *)0x0;
        }
        else {
          local_60 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(plStack_38->kw);
        pcVar5 = lyplg_ext_stmt2str(LY_STMT_YIN_ELEMENT);
        ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                ,pcVar4,pcVar5);
        return LY_EVALID;
      }
      LVar2 = lysp_stmt_ext(ctx,plStack_38,stmt->kw,0,exts);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_48 = (ly_ctx *)0x0;
    }
    else {
      local_48 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_48,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","yin-element");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_yinelem(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint16_t *flags, struct lysp_ext_instance **exts)
{
    if (*flags & LYS_YINELEM_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "yin-element");
        return LY_EVALID;
    }

    /* store flag */
    if (!strcmp(stmt->arg, "true")) {
        *flags |= LYS_YINELEM_TRUE;
    } else if (!strcmp(stmt->arg, "false")) {
        *flags |= LYS_YINELEM_FALSE;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)strlen(stmt->arg), stmt->arg, "yin-element");
        return LY_EVALID;
    }

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_YIN_ELEMENT));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}